

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_options.cpp
# Opt level: O1

string * __thiscall
RandomizerOptions::goal_abi_cxx11_(string *__return_storage_ptr__,RandomizerOptions *this)

{
  ulong uVar1;
  allocator<char> local_9;
  
  uVar1 = (ulong)this->_goal;
  if (uVar1 < 3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,GOALS_TABLE._M_elems[uVar1],&local_9);
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar1,3);
}

Assistant:

std::string RandomizerOptions::goal() const
{
    return GOALS_TABLE.at(_goal);
}